

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_LogicalOrExprPrecedence_Test::ExprWriterTest_LogicalOrExprPrecedence_Test
          (ExprWriterTest_LogicalOrExprPrecedence_Test *this)

{
  undefined8 *in_RDI;
  ExprWriterTest *in_stack_00000030;
  
  ExprWriterTest::ExprWriterTest(in_stack_00000030);
  *in_RDI = &PTR__ExprWriterTest_LogicalOrExprPrecedence_Test_001ed5d0;
  in_RDI[2] = &PTR__ExprWriterTest_LogicalOrExprPrecedence_Test_001ed610;
  return;
}

Assistant:

TEST_F(ExprWriterTest, LogicalOrExprPrecedence) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  CHECK_WRITE("if 0 || 1 || 1 then 1",
      MakeIf(MakeBinaryLogical(ex::OR, MakeBinaryLogical(ex::OR, l0, l1), l1),
          n1, n0));
  CHECK_WRITE("if 0 || (1 || 1) then 1",
      MakeIf(MakeBinaryLogical(ex::OR, l0, MakeBinaryLogical(ex::OR, l1, l1)),
          n1, n0));
  CHECK_WRITE("if 0 || 1 && 1 then 1",
      MakeIf(MakeBinaryLogical(ex::OR, l0, MakeBinaryLogical(ex::AND, l1, l1)),
          n1, n0));
}